

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderHeatmap<unsigned_long_long,ImPlot::TransformerLinLog>
               (TransformerLinLog transformer,ImDrawList *DrawList,unsigned_long_long *values,
               int rows,int cols,double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min
               ,ImPlotPoint *bounds_max,bool reverse_y)

{
  ImVec2 IVar1;
  undefined8 uVar2;
  float fVar3;
  ulong uVar4;
  ImPlotPlot *pIVar5;
  undefined1 auVar6 [16];
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  unsigned_long_long *puVar9;
  ImU32 col;
  ulong uVar10;
  ImPlotPoint *pIVar11;
  long lVar12;
  ulong uVar13;
  ImPlotContext *gp;
  long lVar14;
  ulong uVar15;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar16;
  double dVar17;
  double in_XMM1_Qb;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar21;
  undefined1 auVar20 [16];
  double dVar22;
  ImVec4 IVar23;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_1a0;
  undefined1 local_198 [24];
  char *local_180;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  double local_168;
  double dStack_160;
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined8 uStack_140;
  double local_130;
  double local_128;
  unsigned_long_long *local_120;
  double local_118;
  double local_110;
  long local_108;
  long local_100;
  ulong local_f8;
  double local_f0;
  unsigned_long_long *local_e8;
  double local_e0;
  RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLinLin> local_d8;
  undefined1 local_b8 [56];
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double dStack_60;
  double local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  pIVar7 = GImPlot;
  local_198._8_8_ = local_198._0_8_;
  dVar21 = (double)CONCAT44(in_XMM0_Dd,in_XMM0_Dc);
  if ((((scale_min == 0.0) && (dVar21 = (double)CONCAT44(in_XMM0_Dd,in_XMM0_Dc), !NAN(scale_min)))
      && (dVar21 = (double)CONCAT44(in_XMM0_Dd,in_XMM0_Dc), scale_max == 0.0)) &&
     (dVar21 = (double)CONCAT44(in_XMM0_Dd,in_XMM0_Dc), !NAN(scale_max))) {
    uVar10 = *values;
    uVar13 = uVar10;
    if (1 < cols * rows) {
      uVar15 = 1;
      do {
        uVar4 = values[uVar15];
        if (uVar4 < uVar13) {
          uVar13 = uVar4;
        }
        if (uVar10 < uVar4) {
          uVar10 = uVar4;
        }
        uVar15 = uVar15 + 1;
      } while ((uint)(cols * rows) != uVar15);
    }
    auVar19._8_4_ = (int)(uVar13 >> 0x20);
    auVar19._0_8_ = uVar13;
    auVar19._12_4_ = 0x45300000;
    dVar21 = auVar19._8_8_ - 1.9342813113834067e+25;
    scale_min = dVar21 + ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
    auVar20._8_4_ = (int)(uVar10 >> 0x20);
    auVar20._0_8_ = uVar10;
    auVar20._12_4_ = 0x45300000;
    in_XMM1_Qb = auVar20._8_8_ - 1.9342813113834067e+25;
    scale_max = in_XMM1_Qb + ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
  }
  local_180 = fmt;
  if ((scale_min == scale_max) && (!NAN(scale_min) && !NAN(scale_max))) {
    dVar22 = log10(bounds_min->y / GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
    pIVar8 = GImPlot;
    pIVar5 = pIVar7->CurrentPlot;
    dVar21 = pIVar5->YAxis[transformer.YAxis].Range.Min;
    IVar1 = pIVar7->PixelRange[transformer.YAxis].Min;
    local_198._0_8_ = DrawList;
    local_b8._4_4_ =
         (float)(pIVar7->My[transformer.YAxis] *
                 (((double)(float)(dVar22 / pIVar7->LogDenY[transformer.YAxis]) *
                   (pIVar5->YAxis[transformer.YAxis].Range.Max - dVar21) + dVar21) - dVar21) +
                (double)IVar1.y);
    local_b8._0_4_ =
         (float)(pIVar7->Mx * (bounds_min->x - (pIVar5->XAxis).Range.Min) + (double)IVar1.x);
    dVar22 = log10(bounds_max->y / GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
    pIVar5 = pIVar8->CurrentPlot;
    dVar21 = pIVar5->YAxis[transformer.YAxis].Range.Min;
    IVar1 = pIVar8->PixelRange[transformer.YAxis].Min;
    local_d8.Getter =
         (GetterHeatmap<unsigned_long_long> *)
         CONCAT44((float)(pIVar8->My[transformer.YAxis] *
                          (((double)(float)(dVar22 / pIVar8->LogDenY[transformer.YAxis]) *
                            (pIVar5->YAxis[transformer.YAxis].Range.Max - dVar21) + dVar21) - dVar21
                          ) + (double)IVar1.y),
                  (float)(pIVar8->Mx * (bounds_max->x - (pIVar5->XAxis).Range.Min) + (double)IVar1.x
                         ));
    col = GetColormapColorU32(0,(pIVar7->Style).Colormap);
    ImDrawList::AddRectFilled
              ((ImDrawList *)local_198._0_8_,(ImVec2 *)local_b8,(ImVec2 *)&local_d8,col,0.0,0);
    return;
  }
  if (reverse_y) {
    dVar22 = -1.0;
    pIVar11 = bounds_max;
  }
  else {
    dVar22 = 1.0;
    pIVar11 = bounds_min;
  }
  local_198._0_8_ = (undefined8)cols;
  local_198._8_8_ = (undefined8)rows;
  local_118 = pIVar11->y;
  local_b8._8_4_ = cols * rows;
  local_80 = bounds_min->x;
  auVar18._0_8_ = bounds_max->x - local_80;
  auVar18._8_8_ = bounds_max->y - bounds_min->y;
  auVar6._8_8_ = local_198._8_8_;
  auVar6._0_8_ = local_198._0_8_;
  local_b8._40_16_ = divpd(auVar18,auVar6);
  local_68 = local_b8._40_8_ * 0.5;
  dStack_60 = local_b8._48_8_ * 0.5;
  pIVar5 = GImPlot->CurrentPlot;
  fVar3 = (float)pIVar5->CurrentYAxis;
  local_158._8_4_ = SUB84(dVar21,0);
  local_158._0_8_ = scale_min;
  local_158._12_4_ = (int)((ulong)dVar21 >> 0x20);
  local_b8._0_8_ = values;
  local_b8._12_4_ = rows;
  local_b8._16_4_ = cols;
  local_b8._24_8_ = scale_min;
  local_b8._32_8_ = scale_max;
  local_78 = local_118;
  local_70 = dVar22;
  local_168 = scale_max;
  dStack_160 = in_XMM1_Qb;
  switch(GImPlot->Scales[(int)fVar3]) {
  case 0:
    local_d8.Transformer = (TransformerLinLin *)&local_1a0;
    local_1a0.x = fVar3;
    local_d8.Getter = (GetterHeatmap<unsigned_long_long> *)local_b8;
    local_d8.Prims = local_b8._8_4_;
    RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,ImPlot::TransformerLinLin>>
              (&local_d8,DrawList,&pIVar5->PlotRect);
    break;
  case 1:
    local_d8.Transformer = (TransformerLinLin *)&local_1a0;
    local_1a0.x = fVar3;
    local_d8.Getter = (GetterHeatmap<unsigned_long_long> *)local_b8;
    local_d8.Prims = local_b8._8_4_;
    RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,ImPlot::TransformerLogLin>>
              ((RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLogLin> *
               )&local_d8,DrawList,&pIVar5->PlotRect);
    break;
  case 2:
    local_d8.Transformer = (TransformerLinLin *)&local_1a0;
    local_1a0.x = fVar3;
    local_d8.Getter = (GetterHeatmap<unsigned_long_long> *)local_b8;
    local_d8.Prims = local_b8._8_4_;
    RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,ImPlot::TransformerLinLog>>
              ((RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLinLog> *
               )&local_d8,DrawList,&pIVar5->PlotRect);
    break;
  case 3:
    local_d8.Transformer = (TransformerLinLin *)&local_1a0;
    local_1a0.x = fVar3;
    local_d8.Getter = (GetterHeatmap<unsigned_long_long> *)local_b8;
    local_d8.Prims = local_b8._8_4_;
    RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,ImPlot::TransformerLogLog>>
              ((RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLogLog> *
               )&local_d8,DrawList,&pIVar5->PlotRect);
    break;
  default:
    goto switchD_00238782_default;
  }
  scale_min = (double)local_158._0_8_;
  scale_max = local_168;
  in_XMM1_Qb = dStack_160;
switchD_00238782_default:
  if ((fmt != (char *)0x0) && (0 < rows)) {
    local_58 = (bounds_max->x - bounds_min->x) / (double)local_198._0_8_;
    local_128 = (bounds_max->y - bounds_min->y) / (double)local_198._8_8_;
    lVar12 = (long)transformer.YAxis;
    local_168 = scale_max - scale_min;
    local_f8 = (ulong)(uint)cols;
    local_130 = local_128 * 0.5;
    local_148 = local_58 * 0.5;
    local_108 = lVar12 << 4;
    local_110 = 0.0;
    local_16c = 0;
    local_170 = 0;
    uStack_50 = 0;
    local_178 = rows;
    local_174 = cols;
    dStack_160 = in_XMM1_Qb;
    local_120 = values;
    local_100 = lVar12;
    local_f0 = local_148;
    do {
      if (0 < cols) {
        local_e0 = (local_128 * local_110 + local_130) * dVar22 + local_118;
        local_e8 = values + local_170;
        local_198._0_16_ = ZEXT816(0);
        lVar14 = 0;
        do {
          pIVar7 = GImPlot;
          local_148 = bounds_min->x + local_148;
          uStack_140 = 0;
          dVar17 = log10(local_e0 / GImPlot->CurrentPlot->YAxis[lVar12].Range.Min);
          puVar9 = local_e8;
          pIVar5 = pIVar7->CurrentPlot;
          dVar21 = pIVar5->YAxis[lVar12].Range.Min;
          uVar2 = *(undefined8 *)((long)&pIVar7->PixelRange[0].Min.x + local_108);
          local_148._0_4_ =
               (float)(pIVar7->Mx *
                       ((local_148 + local_58 * (double)local_198._0_8_) - (pIVar5->XAxis).Range.Min
                       ) + (double)(float)uVar2);
          local_148._4_4_ =
               (float)(pIVar7->My[local_100] *
                       ((dVar21 + (double)(float)(dVar17 / pIVar7->LogDenY[local_100]) *
                                  (pIVar5->YAxis[lVar12].Range.Max - dVar21)) - dVar21) +
                      (double)(float)((ulong)uVar2 >> 0x20));
          uStack_140 = 0;
          sprintf((char *)&local_d8,local_180,local_e8[lVar14]);
          IVar1 = ImGui::CalcTextSize((char *)&local_d8,(char *)0x0,false,-1.0);
          local_48._8_4_ = extraout_XMM0_Dc;
          local_48._0_4_ = IVar1.x;
          local_48._4_4_ = IVar1.y;
          local_48._12_4_ = extraout_XMM0_Dd;
          dVar17 = ((((double)CONCAT44(0x45300000,(int)(puVar9[lVar14] >> 0x20)) -
                     1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)puVar9[lVar14]) - 4503599627370496.0)) -
                   (double)local_158._0_8_) / local_168;
          dVar21 = 1.0;
          if (dVar17 <= 1.0) {
            dVar21 = dVar17;
          }
          IVar23 = SampleColormap((float)(double)(~-(ulong)(dVar17 < 0.0) & (ulong)dVar21),-1);
          local_1a0.y = (float)local_48._4_4_ * -0.5 + local_148._4_4_;
          local_1a0.x = (float)local_48._0_4_ * -0.5 + (float)local_148;
          ImDrawList::AddText(DrawList,&local_1a0,
                              -(uint)(IVar23.z * 0.114 + IVar23.x * 0.299 + IVar23.y * 0.587 <= 0.5)
                              | 0xff000000,(char *)&local_d8,(char *)0x0);
          uVar16 = local_198._12_4_;
          local_198._8_4_ = local_198._8_4_;
          local_198._0_8_ = local_198._0_8_ + 1.0;
          local_198._12_4_ = uVar16;
          lVar14 = lVar14 + 1;
          local_148 = local_f0;
        } while ((int)local_f8 != (int)lVar14);
        local_170 = local_170 + (int)lVar14;
        values = local_120;
        rows = local_178;
        cols = local_174;
      }
      local_110 = local_110 + 1.0;
      local_16c = local_16c + 1;
    } while (local_16c != rows);
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max, bool reverse_y) {
    ImPlotContext& gp = *GImPlot;
    if (scale_min == 0 && scale_max == 0) {
        T temp_min, temp_max;
        ImMinMaxArray(values,rows*cols,&temp_min,&temp_max);
        scale_min = (double)temp_min;
        scale_max = (double)temp_max;
    }
    if (scale_min == scale_max) {
        ImVec2 a = transformer(bounds_min);
        ImVec2 b = transformer(bounds_max);
        ImU32  col = GetColormapColorU32(0,gp.Style.Colormap);
        DrawList.AddRectFilled(a, b, col);
        return;
    }
    const double yref = reverse_y ? bounds_max.y : bounds_min.y;
    const double ydir = reverse_y ? -1 : 1;
    GetterHeatmap<T> getter(values, rows, cols, scale_min, scale_max, (bounds_max.x - bounds_min.x) / cols, (bounds_max.y - bounds_min.y) / rows, bounds_min.x, yref, ydir);
    switch (GetCurrentScale()) {
        case ImPlotScale_LinLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLin>(getter, TransformerLinLin()), DrawList, gp.CurrentPlot->PlotRect); break;
        case ImPlotScale_LogLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLin>(getter, TransformerLogLin()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LinLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLog>(getter, TransformerLinLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LogLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLog>(getter, TransformerLogLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
    }
    if (fmt != NULL) {
        const double w = (bounds_max.x - bounds_min.x) / cols;
        const double h = (bounds_max.y - bounds_min.y) / rows;
        const ImPlotPoint half_size(w*0.5,h*0.5);
        int i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = yref + ydir * (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImClamp(ImRemap01((double)values[i], scale_min, scale_max),0.0,1.0);
                ImVec4 color = SampleColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}